

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::pareto_dist<long_double>::operator()(pareto_dist<long_double> *this,lcg64_shift *r)

{
  result_type_conflict3 *prVar1;
  param_type *in_RSI;
  param_type *in_RDI;
  double extraout_XMM0_Qa;
  double __x;
  double in_XMM1_Qa;
  
  utility::uniformoo<long_double,trng::lcg64_shift>((lcg64_shift *)0x370792);
  __x = param_type::gamma(in_RDI,extraout_XMM0_Qa);
  std::pow(__x,in_XMM1_Qa);
  prVar1 = param_type::theta(&in_RDI->gamma_,in_RSI);
  return prVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return (math::pow(utility::uniformoo<result_type>(r), -1 / P.gamma()) - 1) * P.theta();
    }